

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

void __thiscall tonk::Connection::onTimeSyncSendTimer(Connection *this)

{
  uint uVar1;
  Result result;
  uint8_t buffer [11];
  undefined1 local_38 [40];
  
  local_38._13_3_ = (int3)(int)(this->Incoming).AntiReplay.LargestSequence.Value + 1;
  uVar1 = (this->TimeSync).WindowedMinTS24Deltas.Samples[0].Value.Value;
  local_38[0x10] = (undefined1)uVar1;
  local_38._17_3_ = (undefined3)(uVar1 >> 8);
  local_38._24_12_ =
       (undefined1  [12])ReceiverBandwidthControl::GetStatistics(&this->ReceiverControl);
  ReceiverStatistics::Compress((ReceiverStatistics *)(local_38 + 0x18),local_38 + 0x13);
  SessionOutgoing::QueueUnreliable
            ((SessionOutgoing *)local_38,(int)this + 0x168,(uint8_t *)0x0,(size_t)(local_38 + 0xd));
  if ((ErrorResult *)local_38._0_8_ != (ErrorResult *)0x0) {
    RefCounter::StartShutdown
              (&(this->super_IConnection).SelfRefCount,(uint)*(ErrorCodeT *)(local_38._0_8_ + 0x30),
               (Result *)local_38);
  }
  Result::~Result((Result *)local_38);
  return;
}

Assistant:

void Connection::onTimeSyncSendTimer()
{
    uint8_t buffer[kTimeSyncMessageBytes];

    // Write next expected nonce
    siamese::WriteU24_LE_Min4Bytes(buffer, Incoming.GetNextExpectedNonce24());

    // Write MinDeltaTS24
    siamese::WriteU24_LE_Min4Bytes(buffer + 3, TimeSync.GetMinDeltaTS24().ToUnsigned());

    // Write ReceiverStatistics
    const ReceiverStatistics stats = ReceiverControl.GetStatistics();
    stats.Compress(buffer + 3 + 3);

    Result result = Outgoing.QueueUnreliable(
        protocol::MessageType_TimeSync,
        buffer,
        kTimeSyncMessageBytes);

    if (result.IsFail()) {
        SelfRefCount.StartShutdown((unsigned)result.GetErrorCode(), result);
    }
}